

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void str_sanitize(char *str_in)

{
  uchar *str;
  char *str_in_local;
  
  for (str = (uchar *)str_in; *str != '\0'; str = str + 1) {
    if ((((*str < 0x20) && (*str != '\r')) && (*str != '\n')) && (*str != '\t')) {
      *str = ' ';
    }
  }
  return;
}

Assistant:

void str_sanitize(char *str_in)
{
	unsigned char *str = (unsigned char *)str_in;
	while(*str)
	{
		if(*str < 32 && !(*str == '\r') && !(*str == '\n') && !(*str == '\t'))
			*str = ' ';
		str++;
	}
}